

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O0

int main(void)

{
  initializer_list<Point2D> __l;
  size_type sVar1;
  int status;
  double best_error;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> best_consensus_set;
  LineModel best_model;
  int d;
  double t;
  int n;
  int maxIterations;
  int data_size;
  allocator<Point2D> local_89;
  Point2D local_88;
  Point2D local_78;
  Point2D local_68;
  Point2D local_58;
  Point2D local_48;
  Point2D *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<Point2D,_std::allocator<Point2D>_> Point_sets;
  
  Point_sets.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  Point2D::Point2D(&local_88,3.0,4.0);
  Point2D::Point2D(&local_78,6.0,8.0);
  Point2D::Point2D(&local_68,9.0,12.0);
  Point2D::Point2D(&local_58,15.0,20.0);
  Point2D::Point2D(&local_48,10.0,-10.0);
  local_30 = 5;
  local_38 = &local_88;
  std::allocator<Point2D>::allocator(&local_89);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<Point2D,_std::allocator<Point2D>_>::vector
            ((vector<Point2D,_std::allocator<Point2D>_> *)local_28,__l,&local_89);
  std::allocator<Point2D>::~allocator(&local_89);
  sVar1 = std::vector<Point2D,_std::allocator<Point2D>_>::size
                    ((vector<Point2D,_std::allocator<Point2D>_> *)local_28);
  LineModel::LineModel
            ((LineModel *)&best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &best_error);
  runRansac((vector<Point2D,_std::allocator<Point2D>_> *)local_28,2,0x32,0.01,
            (int)((double)(int)sVar1 * 0.5),
            (LineModel *)&best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count,
            (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
            &best_error,(double *)&stack0xfffffffffffffef8);
  LineModel::printLineParam
            ((LineModel *)&best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Point_sets.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &best_error);
  LineModel::~LineModel
            ((LineModel *)&best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<Point2D,_std::allocator<Point2D>_>::~vector
            ((vector<Point2D,_std::allocator<Point2D>_> *)local_28);
  return Point_sets.super__Vector_base<Point2D,_std::allocator<Point2D>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {

	vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(6, 8), Point2D(9, 12), Point2D(15, 20), Point2D(10,-10) };
        //vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(3, 7), Point2D(10,-10) };
        //vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(6, 4), Point2D(9, 4), Point2D(15, 4), Point2D(10,-10) };
	int data_size = Point_sets.size();
	//2.设置输入量
	int maxIterations = 50;   //最大迭代次数
	int n = 2;                //模型自由度
	double t = 0.01;        //用于决定数据是否适应于模型的阀值
	int d = data_size * 0.5; //判定模型是否适用于数据集的数据数目
	//3.初始化输出量
	LineModel best_model;            //最佳线性模型
	set<size_t> best_consensus_set;  //记录一致点索引的set
	double best_error;              //最小残差
	//4.运行RANSAC            
	int status = runRansac(Point_sets, n, maxIterations, t, d, best_model, best_consensus_set, best_error);
	//5.输出
	best_model.printLineParam();
	return 0;
}